

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O2

char * glcts::TextureCubeMapArrayGetterCalls::getStringForGetTexLevelParameterPname(GLenum pname)

{
  switch(pname) {
  case 0x8c10:
    return "GL_TEXTURE_RED_TYPE";
  case 0x8c11:
    return "GL_TEXTURE_GREEN_TYPE";
  case 0x8c12:
    return "GL_TEXTURE_BLUE_TYPE";
  case 0x8c13:
    return "GL_TEXTURE_ALPHA_TYPE";
  case 0x8c14:
  case 0x8c15:
    goto switchD_00d388a6_caseD_8c14;
  case 0x8c16:
    return "GL_TEXTURE_DEPTH_TYPE";
  default:
    switch(pname) {
    case 0x805c:
      return "GL_TEXTURE_RED_SIZE";
    case 0x805d:
      return "GL_TEXTURE_GREEN_SIZE";
    case 0x805e:
      return "GL_TEXTURE_BLUE_SIZE";
    case 0x805f:
      return "GL_TEXTURE_ALPHA_SIZE";
    }
    if (pname == 0x1000) {
      return "GL_TEXTURE_WIDTH";
    }
    if (pname == 0x1001) {
      return "GL_TEXTURE_HEIGHT";
    }
    if (pname == 0x1003) {
      return "GL_TEXTURE_INTERNAL_FORMAT";
    }
    if (pname == 0x8071) {
      return "GL_TEXTURE_DEPTH";
    }
    if (pname == 0x86a1) {
      return "GL_TEXTURE_COMPRESSED";
    }
    if (pname == 0x884a) {
      return "GL_TEXTURE_DEPTH_SIZE";
    }
    if (pname == 0x88f1) {
      return "GL_TEXTURE_STENCIL_SIZE";
    }
    if (pname == 0x8c3f) {
      return "GL_TEXTURE_SHARED_SIZE";
    }
switchD_00d388a6_caseD_8c14:
    return "UNKNOWN PARAMETER NAME";
  }
}

Assistant:

const char* TextureCubeMapArrayGetterCalls::getStringForGetTexLevelParameterPname(glw::GLenum pname)
{
	if (pname == GL_TEXTURE_COMPRESSED)
		return "GL_TEXTURE_COMPRESSED";
	if (pname == GL_TEXTURE_ALPHA_SIZE)
		return "GL_TEXTURE_ALPHA_SIZE";
	if (pname == GL_TEXTURE_BLUE_SIZE)
		return "GL_TEXTURE_BLUE_SIZE";
	if (pname == GL_TEXTURE_GREEN_SIZE)
		return "GL_TEXTURE_GREEN_SIZE";
	if (pname == GL_TEXTURE_RED_SIZE)
		return "GL_TEXTURE_RED_SIZE";
	if (pname == GL_TEXTURE_DEPTH_SIZE)
		return "GL_TEXTURE_DEPTH_SIZE";
	if (pname == GL_TEXTURE_SHARED_SIZE)
		return "GL_TEXTURE_SHARED_SIZE";
	if (pname == GL_TEXTURE_STENCIL_SIZE)
		return "GL_TEXTURE_STENCIL_SIZE";
	if (pname == GL_TEXTURE_ALPHA_TYPE)
		return "GL_TEXTURE_ALPHA_TYPE";
	if (pname == GL_TEXTURE_BLUE_TYPE)
		return "GL_TEXTURE_BLUE_TYPE";
	if (pname == GL_TEXTURE_GREEN_TYPE)
		return "GL_TEXTURE_GREEN_TYPE";
	if (pname == GL_TEXTURE_RED_TYPE)
		return "GL_TEXTURE_RED_TYPE";
	if (pname == GL_TEXTURE_DEPTH_TYPE)
		return "GL_TEXTURE_DEPTH_TYPE";
	if (pname == GL_TEXTURE_INTERNAL_FORMAT)
		return "GL_TEXTURE_INTERNAL_FORMAT";
	if (pname == GL_TEXTURE_WIDTH)
		return "GL_TEXTURE_WIDTH";
	if (pname == GL_TEXTURE_HEIGHT)
		return "GL_TEXTURE_HEIGHT";
	if (pname == GL_TEXTURE_DEPTH)
		return "GL_TEXTURE_DEPTH";

	return "UNKNOWN PARAMETER NAME";
}